

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpectedFunctionsListTest.cpp
# Opt level: O1

void __thiscall
TEST_MockExpectedCallsList_hasFinalizedMatchingExpectations_listHasFinalizedCallThatIgnoresParameters_TestShell
::
~TEST_MockExpectedCallsList_hasFinalizedMatchingExpectations_listHasFinalizedCallThatIgnoresParameters_TestShell
          (TEST_MockExpectedCallsList_hasFinalizedMatchingExpectations_listHasFinalizedCallThatIgnoresParameters_TestShell
           *this)

{
  ExecFunctionTestShell::~ExecFunctionTestShell((ExecFunctionTestShell *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockExpectedCallsList, hasFinalizedMatchingExpectations_listHasFinalizedCallThatIgnoresParameters)
{
    list->addExpectedCall(call1);
    list->addExpectedCall(call2);
    call1->ignoreOtherParameters();
    call2->withParameter("param", 0);

    call1->finalizeActualCallMatch();

    CHECK(list->hasFinalizedMatchingExpectations());
}